

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O0

void __thiscall
Js::StringProfiler::StringProfiler(StringProfiler *this,PageAllocator *pageAllocator)

{
  ThreadContextId pvVar1;
  PageAllocator *pageAllocator_local;
  StringProfiler *this_local;
  
  Memory::ArenaAllocator::ArenaAllocator
            (&this->allocator,L"StringProfiler",pageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  pvVar1 = GetCurrentThreadContextId();
  this->mainThreadId = pvVar1;
  this->discardedWrongThread = 0;
  this->embeddedNULChars = 0;
  this->embeddedNULStrings = 0;
  this->emptyStrings = 0;
  this->singleCharStrings = 0;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->stringLengthMetrics,&this->allocator,0);
  JsUtil::
  BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->stringConcatMetrics,&this->allocator,0x2b);
  return;
}

Assistant:

StringProfiler::StringProfiler(PageAllocator * pageAllocator)
      : allocator(_u("StringProfiler"), pageAllocator, Throw::OutOfMemory ),
        mainThreadId(GetCurrentThreadContextId() ),
        discardedWrongThread(0),
        stringLengthMetrics(&allocator),
        embeddedNULChars(0),
        embeddedNULStrings(0),
        emptyStrings(0),
        singleCharStrings(0),
        stringConcatMetrics(&allocator, 43)
    {
    }